

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_star_expression.cpp
# Opt level: O1

optional_ptr<duckdb::ParsedExpression,_true>
duckdb::Binder::GetResolvedColumnExpression(ParsedExpression *root_expr)

{
  OperatorExpression *pOVar1;
  reference pvVar2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_18;
  
  local_18._M_head_impl = root_expr;
  while( true ) {
    optional_ptr<duckdb::ParsedExpression,_true>::CheckValid
              ((optional_ptr<duckdb::ParsedExpression,_true> *)&local_18);
    if (((local_18._M_head_impl)->super_BaseExpression).type == COLUMN_REF) {
      return (optional_ptr<duckdb::ParsedExpression,_true>)local_18._M_head_impl;
    }
    optional_ptr<duckdb::ParsedExpression,_true>::CheckValid
              ((optional_ptr<duckdb::ParsedExpression,_true> *)&local_18);
    if (((local_18._M_head_impl)->super_BaseExpression).type != OPERATOR_COALESCE) break;
    optional_ptr<duckdb::ParsedExpression,_true>::CheckValid
              ((optional_ptr<duckdb::ParsedExpression,_true> *)&local_18);
    pOVar1 = BaseExpression::Cast<duckdb::OperatorExpression>
                       (&(local_18._M_head_impl)->super_BaseExpression);
    pvVar2 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::operator[](&pOVar1->children,0);
    local_18._M_head_impl =
         (pvVar2->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    if (local_18._M_head_impl == (ParsedExpression *)0x0) {
      return (optional_ptr<duckdb::ParsedExpression,_true>)(ParsedExpression *)0x0;
    }
  }
  return (optional_ptr<duckdb::ParsedExpression,_true>)(BaseExpression *)0x0;
}

Assistant:

optional_ptr<ParsedExpression> Binder::GetResolvedColumnExpression(ParsedExpression &root_expr) {
	optional_ptr<ParsedExpression> expr = &root_expr;
	while (expr) {
		if (expr->GetExpressionType() == ExpressionType::COLUMN_REF) {
			break;
		}
		if (expr->GetExpressionType() == ExpressionType::OPERATOR_COALESCE) {
			expr = expr->Cast<OperatorExpression>().children[0].get();
		} else {
			// unknown expression
			return nullptr;
		}
	}
	return expr;
}